

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-Logic-Training.cpp
# Opt level: O0

int main(void)

{
  value_type vVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<double> __l_13;
  initializer_list<double> __l_14;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_15;
  initializer_list<double> __l_16;
  reference pvVar2;
  reference pvVar3;
  Scalar *pSVar4;
  MatrixXd se;
  int i;
  int j;
  vector<double,_std::allocator<double>_> or_labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  or_dataset;
  vector<double,_std::allocator<double>_> and_labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  and_dataset;
  vector<double,_std::allocator<double>_> xor_labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  xor_dataset;
  double learning_rate;
  MatrixXd y;
  MatrixXd X;
  ANN n;
  ostream *in_stack_fffffffffffff738;
  ANN *in_stack_fffffffffffff740;
  ostream *in_stack_fffffffffffff748;
  ostream *in_stack_fffffffffffff750;
  int *in_stack_fffffffffffff758;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffff760;
  allocator_type *in_stack_fffffffffffff768;
  allocator<char> *in_stack_fffffffffffff770;
  iterator in_stack_fffffffffffff778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff780;
  int *in_stack_fffffffffffff790;
  ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_fffffffffffff798;
  MatrixXd *in_stack_fffffffffffff7c0;
  ANN *in_stack_fffffffffffff7c8;
  string *in_stack_fffffffffffff7f0;
  undefined8 in_stack_fffffffffffff7f8;
  int size;
  ANN *in_stack_fffffffffffff800;
  MatrixXd *in_stack_fffffffffffff808;
  ANN *this;
  undefined1 ***local_7d8;
  undefined1 ***local_770;
  undefined1 ***local_708;
  int local_5a4;
  int local_5a0;
  undefined1 local_599 [79];
  undefined1 local_54a;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 *local_538;
  undefined8 local_530;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 *local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 **local_4b0;
  undefined1 **local_4a8 [3];
  undefined1 local_490 [24];
  undefined1 local_478 [24];
  undefined1 local_460 [24];
  undefined8 **local_448;
  undefined8 local_440;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_438;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3ca;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 *local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 *local_368;
  undefined8 local_360;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 **local_330;
  undefined1 **local_328 [3];
  undefined1 local_310 [24];
  undefined1 local_2f8 [24];
  undefined1 local_2e0 [24];
  undefined8 **local_2c8;
  undefined8 local_2c0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined1 local_242;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 *local_208;
  undefined8 local_200;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined8 **local_1a8;
  undefined1 **local_1a0 [3];
  undefined1 local_188 [24];
  undefined1 local_170 [24];
  undefined1 local_158 [24];
  undefined8 **local_140;
  undefined8 local_138;
  double local_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_f0;
  undefined4 local_ec;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [48];
  ANN local_48;
  int local_4;
  
  size = (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  local_4 = 0;
  ANN::ANN(in_stack_fffffffffffff740);
  ANN::setInputSize(&local_48,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
  ANN::addLayer(in_stack_fffffffffffff800,size,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
  ANN::addLayer(in_stack_fffffffffffff800,size,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
  ANN::addLayer(in_stack_fffffffffffff800,size,in_stack_fffffffffffff7f0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_ec = 4;
  local_f0 = 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff760,
             in_stack_fffffffffffff758,(int *)in_stack_fffffffffffff750);
  local_10c = 4;
  local_110 = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff760,
             in_stack_fffffffffffff758,(int *)in_stack_fffffffffffff750);
  local_118 = 0.1;
  local_242 = 1;
  local_1a8 = local_1a0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1b8 = &local_1c8;
  local_1b0 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13f8eb);
  __l._M_len = (size_type)in_stack_fffffffffffff780;
  __l._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l,
             in_stack_fffffffffffff768);
  local_1a8 = (undefined8 **)local_188;
  local_1f0 = 0;
  local_1e8 = 0x3ff0000000000000;
  local_1e0 = &local_1f0;
  local_1d8 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13f979);
  __l_00._M_len = (size_type)in_stack_fffffffffffff780;
  __l_00._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_00,
             in_stack_fffffffffffff768);
  local_1a8 = (undefined8 **)local_170;
  local_218 = 0x3ff0000000000000;
  local_210 = 0;
  local_208 = &local_218;
  local_200 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13fa07);
  __l_01._M_len = (size_type)in_stack_fffffffffffff780;
  __l_01._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_01,
             in_stack_fffffffffffff768);
  local_1a8 = (undefined8 **)local_158;
  local_240 = 0x3ff0000000000000;
  local_238 = 0x3ff0000000000000;
  local_230 = &local_240;
  local_228 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13fa91);
  __l_02._M_len = (size_type)in_stack_fffffffffffff780;
  __l_02._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_02,
             in_stack_fffffffffffff768);
  local_242 = 0;
  local_140 = local_1a0;
  local_138 = 4;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x13faf1);
  __l_03._M_len = (size_type)in_stack_fffffffffffff780;
  __l_03._M_array = in_stack_fffffffffffff778;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffff770,__l_03,(allocator_type *)in_stack_fffffffffffff768);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x13fb25);
  local_708 = (undefined1 ***)&local_140;
  do {
    local_708 = local_708 + -3;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
  } while (local_708 != local_1a0);
  std::allocator<double>::~allocator((allocator<double> *)0x13fb84);
  std::allocator<double>::~allocator((allocator<double> *)0x13fb91);
  std::allocator<double>::~allocator((allocator<double> *)0x13fb9e);
  std::allocator<double>::~allocator((allocator<double> *)0x13fbab);
  local_288 = 0x3ff0000000000000;
  uStack_280 = 0xbff0000000000000;
  local_298 = 0xbff0000000000000;
  uStack_290 = 0x3ff0000000000000;
  local_270 = &local_298;
  local_268 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x13fbfa);
  __l_04._M_len = (size_type)in_stack_fffffffffffff780;
  __l_04._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_04,
             in_stack_fffffffffffff768);
  std::allocator<double>::~allocator((allocator<double> *)0x13fc2e);
  local_3ca = 1;
  local_330 = local_328;
  local_350 = 0;
  local_348 = 0;
  local_340 = &local_350;
  local_338 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13fc97);
  __l_05._M_len = (size_type)in_stack_fffffffffffff780;
  __l_05._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_05,
             in_stack_fffffffffffff768);
  local_330 = (undefined8 **)local_310;
  local_378 = 0;
  local_370 = 0x3ff0000000000000;
  local_368 = &local_378;
  local_360 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13fd25);
  __l_06._M_len = (size_type)in_stack_fffffffffffff780;
  __l_06._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_06,
             in_stack_fffffffffffff768);
  local_330 = (undefined8 **)local_2f8;
  local_3a0 = 0x3ff0000000000000;
  local_398 = 0;
  local_390 = &local_3a0;
  local_388 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13fdb3);
  __l_07._M_len = (size_type)in_stack_fffffffffffff780;
  __l_07._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_07,
             in_stack_fffffffffffff768);
  local_330 = (undefined8 **)local_2e0;
  local_3c8 = 0x3ff0000000000000;
  local_3c0 = 0x3ff0000000000000;
  local_3b8 = &local_3c8;
  local_3b0 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x13fe3d);
  __l_08._M_len = (size_type)in_stack_fffffffffffff780;
  __l_08._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_08,
             in_stack_fffffffffffff768);
  local_3ca = 0;
  local_2c8 = local_328;
  local_2c0 = 4;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x13fe9d);
  __l_09._M_len = (size_type)in_stack_fffffffffffff780;
  __l_09._M_array = in_stack_fffffffffffff778;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffff770,__l_09,(allocator_type *)in_stack_fffffffffffff768);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x13fed1);
  local_770 = (undefined1 ***)&local_2c8;
  do {
    local_770 = local_770 + -3;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
  } while (local_770 != local_328);
  std::allocator<double>::~allocator((allocator<double> *)0x13ff30);
  std::allocator<double>::~allocator((allocator<double> *)0x13ff3d);
  std::allocator<double>::~allocator((allocator<double> *)0x13ff4a);
  std::allocator<double>::~allocator((allocator<double> *)0x13ff57);
  local_408 = 0xbff0000000000000;
  uStack_400 = 0x3ff0000000000000;
  local_418 = 0xbff0000000000000;
  uStack_410 = 0xbff0000000000000;
  local_3f8 = &local_418;
  local_3f0 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x13ffa6);
  __l_10._M_len = (size_type)in_stack_fffffffffffff780;
  __l_10._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_10,
             in_stack_fffffffffffff768);
  std::allocator<double>::~allocator((allocator<double> *)0x13ffda);
  local_54a = 1;
  local_4b0 = local_4a8;
  local_4d0 = 0;
  local_4c8 = 0;
  local_4c0 = &local_4d0;
  local_4b8 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x140043);
  __l_11._M_len = (size_type)in_stack_fffffffffffff780;
  __l_11._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_11,
             in_stack_fffffffffffff768);
  local_4b0 = (undefined8 **)local_490;
  local_4f8 = 0;
  local_4f0 = 0x3ff0000000000000;
  local_4e8 = &local_4f8;
  local_4e0 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x1400d1);
  __l_12._M_len = (size_type)in_stack_fffffffffffff780;
  __l_12._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_12,
             in_stack_fffffffffffff768);
  local_4b0 = (undefined8 **)local_478;
  local_520 = 0x3ff0000000000000;
  local_518 = 0;
  local_510 = &local_520;
  local_508 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x14015f);
  __l_13._M_len = (size_type)in_stack_fffffffffffff780;
  __l_13._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_13,
             in_stack_fffffffffffff768);
  local_4b0 = (undefined8 **)local_460;
  local_548 = 0x3ff0000000000000;
  local_540 = 0x3ff0000000000000;
  local_538 = &local_548;
  local_530 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x1401e9);
  __l_14._M_len = (size_type)in_stack_fffffffffffff780;
  __l_14._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_14,
             in_stack_fffffffffffff768);
  local_54a = 0;
  local_448 = local_4a8;
  local_440 = 4;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x140249);
  __l_15._M_len = (size_type)in_stack_fffffffffffff780;
  __l_15._M_array = in_stack_fffffffffffff778;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffff770,__l_15,(allocator_type *)in_stack_fffffffffffff768);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x14027d);
  local_7d8 = (undefined1 ***)&local_448;
  do {
    local_7d8 = local_7d8 + -3;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
  } while (local_7d8 != local_4a8);
  std::allocator<double>::~allocator((allocator<double> *)0x1402dc);
  std::allocator<double>::~allocator((allocator<double> *)0x1402e9);
  std::allocator<double>::~allocator((allocator<double> *)0x1402f6);
  std::allocator<double>::~allocator((allocator<double> *)0x140303);
  local_599._17_8_ = 0x3ff0000000000000;
  local_599._25_8_ = 0x3ff0000000000000;
  local_599._1_8_ = 0xbff0000000000000;
  local_599._9_8_ = 0x3ff0000000000000;
  local_599._33_8_ = local_599 + 1;
  local_599._41_8_ = 4;
  this = (ANN *)local_599;
  std::allocator<double>::allocator((allocator<double> *)0x140352);
  __l_16._M_len = (size_type)in_stack_fffffffffffff780;
  __l_16._M_array = (iterator)in_stack_fffffffffffff778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff770,__l_16,
             in_stack_fffffffffffff768);
  std::allocator<double>::~allocator((allocator<double> *)0x140386);
  for (local_5a0 = 0; local_5a0 < 4; local_5a0 = local_5a0 + 1) {
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_438,(long)local_5a0);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
    in_stack_fffffffffffff800 = (ANN *)*pvVar3;
    in_stack_fffffffffffff808 =
         (MatrixXd *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                   (in_stack_fffffffffffff760,(Index)in_stack_fffffffffffff758,
                    (Index)in_stack_fffffffffffff750);
    (in_stack_fffffffffffff808->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)in_stack_fffffffffffff800;
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_438,(long)local_5a0);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,1);
    vVar1 = *pvVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_fffffffffffff760,(Index)in_stack_fffffffffffff758,
                        (Index)in_stack_fffffffffffff750);
    *pSVar4 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_599 + 0x31),
                        (long)local_5a0);
    vVar1 = *pvVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_fffffffffffff760,(Index)in_stack_fffffffffffff758,
                        (Index)in_stack_fffffffffffff750);
    *pSVar4 = vVar1;
  }
  for (local_5a4 = 0; local_5a4 < 2000; local_5a4 = local_5a4 + 1) {
    ANN::setLearningRate(&local_48,local_118);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff740,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff738);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff740,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff738);
    ANN::fit(this,in_stack_fffffffffffff808,(MatrixXd *)in_stack_fffffffffffff800);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x140b13)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x140b20)
    ;
    if (local_5a4 % 10 == 0) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff740,
                 (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff738);
      ANN::predict(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff768,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff760)
      ;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::array((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)in_stack_fffffffffffff748);
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::pow<int>(in_stack_fffffffffffff798,in_stack_fffffffffffff790);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff740,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                  *)in_stack_fffffffffffff738);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x140bf2);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x140bff);
      in_stack_fffffffffffff750 =
           (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5a4);
      in_stack_fffffffffffff748 = std::operator<<(in_stack_fffffffffffff750,",");
      in_stack_fffffffffffff740 =
           (ANN *)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             in_stack_fffffffffffff750);
      in_stack_fffffffffffff738 =
           (ostream *)
           std::ostream::operator<<(in_stack_fffffffffffff748,(double)in_stack_fffffffffffff740);
      std::ostream::operator<<(in_stack_fffffffffffff738,std::endl<char,std::char_traits<char>>);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x140c7b);
    }
  }
  local_4 = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff750);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff750);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff750);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x140db6);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x140dc3);
  ANN::~ANN(in_stack_fffffffffffff740);
  return local_4;
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setInputSize(2);
    n.addLayer(3, "tanh");
    n.addLayer(3, "tanh");
    n.addLayer(1, "tanh");

    Eigen::MatrixXd X = Eigen::MatrixXd(4, 2);
    Eigen::MatrixXd y = Eigen::MatrixXd(4, 1);
    
    double learning_rate = 0.1;

    vector<vector<double>> xor_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> xor_labels = {-1, 1, 1, -1};

    vector<vector<double>> and_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> and_labels = {-1, -1, -1, 1};

    vector<vector<double>> or_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> or_labels = {-1, 1, 1, 1};
    
    for(int j = 0; j < 4; j++) {
        X(j,0) = or_dataset[j][0];
        X(j,1) = or_dataset[j][1];
        y(j,0) = or_labels[j];
    }

    for(int i = 0; i < 2000; i++) {
        n.setLearningRate(learning_rate);
        n.fit(X, y);
        if(i % 10 == 0) {
            Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            cout << i << "," << se.mean() << endl;
        }
    }
    
    return 0;
}